

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_electronVolt_Test::TestBody(stringToUnits_electronVolt_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_350;
  Message local_348;
  precise_unit local_340;
  allocator local_329;
  string local_328;
  precise_unit local_308;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_7;
  Message local_2e0;
  precise_unit local_2d8;
  allocator local_2c1;
  string local_2c0;
  precise_unit local_2a0;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_6;
  Message local_278;
  precise_unit local_270;
  allocator local_259;
  string local_258;
  precise_unit local_238;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_5;
  Message local_210;
  precise_unit local_208;
  allocator local_1f1;
  string local_1f0;
  precise_unit local_1d0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  Message local_1a8;
  precise_unit local_1a0;
  allocator local_189;
  string local_188;
  precise_unit local_168;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  precise_unit local_138;
  allocator local_121;
  string local_120;
  precise_unit local_100;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  precise_unit local_d0;
  allocator local_b9;
  string local_b8;
  precise_unit local_98;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_electronVolt_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"eV",&local_51);
  uVar2 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_50,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"unit_from_string(\"eV\")","precise::energy::eV",&local_30,
             (precise_unit *)units::precise::energy::eV);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3cc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"neV",&local_b9);
  uVar2 = units::getDefaultFlags();
  local_98 = units::unit_from_string(&local_b8,uVar2);
  local_d0 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::nano,
                        (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_88,"unit_from_string(\"neV\")","precise::nano * precise::energy::eV",
             &local_98,&local_d0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3cd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"ueV",&local_121);
  uVar2 = units::getDefaultFlags();
  local_100 = units::unit_from_string(&local_120,uVar2);
  local_138 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::micro,
                         (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_f0,"unit_from_string(\"ueV\")","precise::micro * precise::energy::eV"
             ,&local_100,&local_138);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3ce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"meV",&local_189);
  uVar2 = units::getDefaultFlags();
  local_168 = units::unit_from_string(&local_188,uVar2);
  local_1a0 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::milli,
                         (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_158,"unit_from_string(\"meV\")",
             "precise::milli * precise::energy::eV",&local_168,&local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3cf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"keV",&local_1f1);
  uVar2 = units::getDefaultFlags();
  local_1d0 = units::unit_from_string(&local_1f0,uVar2);
  local_208 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::kilo,
                         (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1c0,"unit_from_string(\"keV\")","precise::kilo * precise::energy::eV"
             ,&local_1d0,&local_208);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"MeV",&local_259);
  uVar2 = units::getDefaultFlags();
  local_238 = units::unit_from_string(&local_258,uVar2);
  local_270 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::mega,
                         (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_228,"unit_from_string(\"MeV\")","precise::mega * precise::energy::eV"
             ,&local_238,&local_270);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"GeV",&local_2c1);
  uVar2 = units::getDefaultFlags();
  local_2a0 = units::unit_from_string(&local_2c0,uVar2);
  local_2d8 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::giga,
                         (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_290,"unit_from_string(\"GeV\")","precise::giga * precise::energy::eV"
             ,&local_2a0,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"TeV",&local_329);
  uVar2 = units::getDefaultFlags();
  local_308 = units::unit_from_string(&local_328,uVar2);
  local_340 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::tera,
                         (precise_unit *)units::precise::energy::eV);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_2f8,"unit_from_string(\"TeV\")","precise::tera * precise::energy::eV"
             ,&local_308,&local_340);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  return;
}

Assistant:

TEST(stringToUnits, electronVolt)
{
    EXPECT_EQ(unit_from_string("eV"), precise::energy::eV);
    EXPECT_EQ(unit_from_string("neV"), precise::nano * precise::energy::eV);
    EXPECT_EQ(unit_from_string("ueV"), precise::micro * precise::energy::eV);
    EXPECT_EQ(unit_from_string("meV"), precise::milli * precise::energy::eV);
    EXPECT_EQ(unit_from_string("keV"), precise::kilo * precise::energy::eV);
    EXPECT_EQ(unit_from_string("MeV"), precise::mega * precise::energy::eV);
    EXPECT_EQ(unit_from_string("GeV"), precise::giga * precise::energy::eV);
    EXPECT_EQ(unit_from_string("TeV"), precise::tera * precise::energy::eV);
}